

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

int libwebvtt::Parser::ParseNumber(string *line,size_type *idx_ptr)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  int i;
  char c;
  int result;
  size_type *idx;
  size_type *idx_ptr_local;
  string *line_local;
  
  if (((idx_ptr != (size_type *)0x0) && (*idx_ptr != 0xffffffffffffffff)) &&
     (uVar1 = *idx_ptr, uVar3 = std::__cxx11::string::length(), uVar1 < uVar3)) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)line);
    iVar2 = isdigit((int)*pcVar4);
    if (iVar2 == 0) {
      return -1;
    }
    i = 0;
    while( true ) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)line);
      iVar2 = isdigit((int)*pcVar4);
      if (iVar2 == 0) {
        return i;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)line);
      if (0xccccccc < i) break;
      if (0x7fffffff - (*pcVar4 + -0x30) < i * 10) {
        return -1;
      }
      i = *pcVar4 + -0x30 + i * 10;
      *idx_ptr = *idx_ptr + 1;
    }
    return -1;
  }
  return -1;
}

Assistant:

int Parser::ParseNumber(const std::string& line,
                        std::string::size_type* idx_ptr) {
  if (idx_ptr == NULL)
    return -1;

  std::string::size_type& idx = *idx_ptr;

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  if (!isdigit(line[idx]))
    return -1;

  int result = 0;

  while (isdigit(line[idx])) {
    const char c = line[idx];
    const int i = c - '0';

    if (result > INT_MAX / 10)
      return -1;

    result *= 10;

    if (result > INT_MAX - i)
      return -1;

    result += i;

    ++idx;
  }

  return result;
}